

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *capabilityInfo1;
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *capabilityInfo2;
  
  capabilityInfo1 =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)32>
                 (sobj1);
  capabilityInfo2 =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)32>
                 (sobj2);
  NSSnapValues::AssertSnapEquiv
            (&capabilityInfo1->Capabilities,&capabilityInfo2->Capabilities,compareMap);
  TTDCompareMap::DiagnosticAssert(compareMap,capabilityInfo1->Index == capabilityInfo2->Index);
  TTDCompareMap::DiagnosticAssert
            (compareMap,
             capabilityInfo1->RemainingElementsValue == capabilityInfo2->RemainingElementsValue);
  TTDCompareMap::DiagnosticAssert
            (compareMap,capabilityInfo1->AlreadyCalledValue == capabilityInfo2->AlreadyCalledValue);
  TTDCompareMap::DiagnosticAssert
            (compareMap,capabilityInfo1->IsRejecting == capabilityInfo2->IsRejecting);
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
            (compareMap,capabilityInfo1->Values,capabilityInfo2->Values,L"values");
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
            (compareMap,capabilityInfo1->RemainingElementsWrapperId,
             capabilityInfo2->RemainingElementsWrapperId);
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
            (compareMap,capabilityInfo1->AlreadyCalledWrapperId,
             capabilityInfo2->AlreadyCalledWrapperId);
  return;
}

Assistant:

void AssertSnapEquiv_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(sobj1);
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(sobj2);

            NSSnapValues::AssertSnapEquiv(&aInfo1->Capabilities, &aInfo2->Capabilities, compareMap);

            compareMap.DiagnosticAssert(aInfo1->Index == aInfo2->Index);
            compareMap.DiagnosticAssert(aInfo1->RemainingElementsValue == aInfo2->RemainingElementsValue);
            compareMap.DiagnosticAssert(aInfo1->AlreadyCalledValue == aInfo2->AlreadyCalledValue);
            compareMap.DiagnosticAssert(aInfo1->IsRejecting == aInfo2->IsRejecting);

            compareMap.CheckConsistentAndAddPtrIdMapping_Special(aInfo1->Values, aInfo2->Values, _u("values"));

            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(aInfo1->RemainingElementsWrapperId, aInfo2->RemainingElementsWrapperId);
            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(aInfo1->AlreadyCalledWrapperId, aInfo2->AlreadyCalledWrapperId);
        }